

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall cnn::ComputationGraph::clear(ComputationGraph *this)

{
  bool bVar1;
  reference ppNVar2;
  __normal_iterator<cnn::Node_**,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_> *in_RDI;
  Node *n;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *__range1;
  Node *in_stack_ffffffffffffffc8;
  __normal_iterator<cnn::Node_**,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
  local_18 [3];
  
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::clear
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)0x5be3cc);
  local_18[0]._M_current =
       (Node **)std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::begin
                          ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                           in_stack_ffffffffffffffc8);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::end
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<cnn::Node_**,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<cnn::Node_**,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 = *ppNVar2;
    if (in_stack_ffffffffffffffc8 != (Node *)0x0) {
      (*in_stack_ffffffffffffffc8->_vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<cnn::Node_**,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>::
    operator++(local_18);
  }
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::clear
            ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)0x5be44c);
  return;
}

Assistant:

void ComputationGraph::clear() {
  parameter_nodes.clear();
  for (auto n : nodes) delete n;
  nodes.clear();
}